

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O0

void Cut_TruthComputeOld(Cut_Cut_t *pCut,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,int fCompl0,int fCompl1)

{
  uint uVar1;
  int nWords;
  uint uVar2;
  uint *puVar3;
  int local_3c;
  int uPhase;
  int i;
  uint *pTruthRes;
  int nTruthWords;
  int fCompl1_local;
  int fCompl0_local;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Cut_t *pCut_local;
  
  nWords = Cut_TruthWords(*(uint *)pCut >> 0x18 & 0xf);
  uVar2 = Cut_TruthPhase(pCut,pCut0);
  uVar1 = *(uint *)pCut;
  puVar3 = Cut_CutReadTruth(pCut0);
  Extra_TruthExpand(uVar1 >> 0x18 & 0xf,nWords,puVar3,uVar2,Cut_TruthComputeOld::uTruth0);
  if (fCompl0 != 0) {
    for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
      Cut_TruthComputeOld::uTruth0[local_3c] = Cut_TruthComputeOld::uTruth0[local_3c] ^ 0xffffffff;
    }
  }
  uVar2 = Cut_TruthPhase(pCut,pCut1);
  uVar1 = *(uint *)pCut;
  puVar3 = Cut_CutReadTruth(pCut1);
  Extra_TruthExpand(uVar1 >> 0x18 & 0xf,nWords,puVar3,uVar2,Cut_TruthComputeOld::uTruth1);
  if (fCompl1 != 0) {
    for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
      Cut_TruthComputeOld::uTruth1[local_3c] = Cut_TruthComputeOld::uTruth1[local_3c] ^ 0xffffffff;
    }
  }
  puVar3 = Cut_CutReadTruth(pCut);
  if ((*(uint *)pCut >> 0x17 & 1) == 0) {
    for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
      puVar3[local_3c] =
           Cut_TruthComputeOld::uTruth0[local_3c] & Cut_TruthComputeOld::uTruth1[local_3c];
    }
  }
  else {
    for (local_3c = 0; local_3c < nWords; local_3c = local_3c + 1) {
      puVar3[local_3c] =
           Cut_TruthComputeOld::uTruth0[local_3c] & Cut_TruthComputeOld::uTruth1[local_3c] ^
           0xffffffff;
    }
  }
  return;
}

Assistant:

void Cut_TruthComputeOld( Cut_Cut_t * pCut, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    static unsigned uTruth0[8], uTruth1[8];
    int nTruthWords = Cut_TruthWords( pCut->nVarsMax );
    unsigned * pTruthRes;
    int i, uPhase;

    // permute the first table
    uPhase = Cut_TruthPhase( pCut, pCut0 );
    Extra_TruthExpand( pCut->nVarsMax, nTruthWords, Cut_CutReadTruth(pCut0), uPhase, uTruth0 );
    if ( fCompl0 ) 
    {
        for ( i = 0; i < nTruthWords; i++ )
            uTruth0[i] = ~uTruth0[i];
    }

    // permute the second table
    uPhase = Cut_TruthPhase( pCut, pCut1 );
    Extra_TruthExpand( pCut->nVarsMax, nTruthWords, Cut_CutReadTruth(pCut1), uPhase, uTruth1 );
    if ( fCompl1 ) 
    {
        for ( i = 0; i < nTruthWords; i++ )
            uTruth1[i] = ~uTruth1[i];
    }

    // write the resulting table
    pTruthRes = Cut_CutReadTruth(pCut);

    if ( pCut->fCompl )
    {
        for ( i = 0; i < nTruthWords; i++ )
            pTruthRes[i] = ~(uTruth0[i] & uTruth1[i]);
    }
    else
    {
        for ( i = 0; i < nTruthWords; i++ )
            pTruthRes[i] = uTruth0[i] & uTruth1[i];
    }
}